

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O2

void __thiscall arm::BrInst::~BrInst(BrInst *this)

{
  std::__cxx11::string::~string((string *)&this->l);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~BrInst() {}